

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

shared_ptr<kratos::Var> __thiscall kratos::Var::cast(Var *this,VarCastType cast_type)

{
  _Base_ptr *pp_Var1;
  pointer ppVar2;
  _Rb_tree_node_base *p_Var3;
  int in_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  undefined4 in_register_00000034;
  set<std::shared_ptr<kratos::VarCasted>,_std::less<std::shared_ptr<kratos::VarCasted>_>,_std::allocator<std::shared_ptr<kratos::VarCasted>_>_>
  *this_00;
  bool bVar5;
  pair<std::_Rb_tree_iterator<std::shared_ptr<kratos::VarCasted>_>,_bool> pVar6;
  shared_ptr<kratos::Var> sVar7;
  Var *local_48;
  VarCasted *local_40;
  shared_ptr<kratos::VarCasted> v;
  VarCastType cast_type_local;
  
  local_48 = (Var *)CONCAT44(in_register_00000034,cast_type);
  if ((in_EDX == 0) && (local_48->is_signed_ == true)) {
    std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
              ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)this,
               (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
               &local_48->super_enable_shared_from_this<kratos::Var>);
    _Var4._M_pi = extraout_RDX;
  }
  else {
    for (p_Var3 = (local_48->casted_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        bVar5 = (_Rb_tree_header *)p_Var3 != &(local_48->casted_)._M_t._M_impl.super__Rb_tree_header
        , bVar5; p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      if ((in_EDX != 7) &&
         (_Var4._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var3 + 1),
         *(int *)&_Var4._M_pi[0x28]._vptr__Sp_counted_base == in_EDX)) {
        (this->super_IRNode)._vptr_IRNode = (_func_int **)_Var4._M_pi;
        ppVar2 = (pointer)p_Var3[1]._M_parent;
        (this->super_IRNode).fn_name_ln.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start = ppVar2;
        if (ppVar2 != (pointer)0x0) {
          _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
          if (__libc_single_threaded == '\0') {
            LOCK();
            pp_Var1 = (_Base_ptr *)&(ppVar2->first)._M_string_length;
            *(int *)pp_Var1 = *(int *)pp_Var1 + 1;
            UNLOCK();
          }
          else {
            pp_Var1 = (_Base_ptr *)&(ppVar2->first)._M_string_length;
            *(int *)pp_Var1 = *(int *)pp_Var1 + 1;
          }
        }
        if (bVar5) goto LAB_00191b9c;
        break;
      }
    }
    this_00 = &local_48->casted_;
    local_40 = (VarCasted *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<kratos::VarCasted,std::allocator<kratos::VarCasted>,kratos::Var*,kratos::VarCastType&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&v,&local_40,
               (allocator<kratos::VarCasted> *)
               ((long)&v.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7),&local_48,
               (VarCastType *)
               &v.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_ptr<kratos::VarCasted,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<kratos::VarCasted,kratos::VarCasted>
              ((__shared_ptr<kratos::VarCasted,(__gnu_cxx::_Lock_policy)2> *)&local_40,local_40);
    pVar6 = std::
            _Rb_tree<std::shared_ptr<kratos::VarCasted>,std::shared_ptr<kratos::VarCasted>,std::_Identity<std::shared_ptr<kratos::VarCasted>>,std::less<std::shared_ptr<kratos::VarCasted>>,std::allocator<std::shared_ptr<kratos::VarCasted>>>
            ::_M_emplace_unique<std::shared_ptr<kratos::VarCasted>&>
                      ((_Rb_tree<std::shared_ptr<kratos::VarCasted>,std::shared_ptr<kratos::VarCasted>,std::_Identity<std::shared_ptr<kratos::VarCasted>>,std::less<std::shared_ptr<kratos::VarCasted>>,std::allocator<std::shared_ptr<kratos::VarCasted>>>
                        *)this_00,(shared_ptr<kratos::VarCasted> *)&local_40);
    _Var4._M_pi = pVar6._8_8_;
    (this->super_IRNode)._vptr_IRNode = (_func_int **)local_40;
    (this->super_IRNode).fn_name_ln.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->super_IRNode).fn_name_ln.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)v.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
LAB_00191b9c:
  sVar7.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
  sVar7.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<kratos::Var>)sVar7.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Var> Var::cast(VarCastType cast_type) {
    if (cast_type == VarCastType::Signed && is_signed_) {
        return shared_from_this();
    } else {
        // optimize memory for speed
        for (auto const &casted : casted_) {
            if (casted->cast_type() == cast_type && cast_type != VarCastType::Resize) {
                return casted;
            }
        }
        auto v = std::make_shared<VarCasted>(this, cast_type);
        casted_.emplace(v);
        return v;
    }
}